

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
::rebalance_after_delete
          (btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
           *this,iterator iter)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  iterator iVar4;
  iterator res;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_38;
  iterator local_28;
  
  local_38.node = iter.node;
  local_38.position = iter.position;
  bVar2 = true;
  local_28.node = local_38.node;
  local_28.position = local_38.position;
  do {
    if (local_28.node ==
        (this->root_).
        super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_*,_false>
        ._M_head_impl) {
      try_shrink(this);
      if (this->size_ == 0) {
        iVar4 = end(this);
        auVar3._0_8_ = iVar4.node;
        auVar3._8_4_ = iVar4.position;
        auVar3._12_4_ = iVar4._12_4_;
        return (iterator)auVar3;
      }
      break;
    }
    if (((ulong)local_28.node & 7) != 0) goto LAB_0023f47e;
    if (0xe < (byte)local_28.node[10]) break;
    bVar1 = try_merge_or_rebalance(this,&local_28);
    if (bVar2) {
      local_38.position = local_28.position;
      local_38.node = local_28.node;
      bVar2 = false;
    }
    if (!bVar1) break;
    if (((ulong)local_28.node & 7) != 0) goto LAB_0023f47e;
    local_28.position = (int)(byte)local_28.node[8];
    local_28.node =
         *(btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
           **)local_28.node;
  } while (bVar1);
  if (((ulong)local_38.node & 7) == 0) {
    if (local_38.position == (uint)(byte)local_38.node[10]) {
      local_38.position = (byte)local_38.node[10] - 1;
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
      ::increment(&local_38);
    }
    iVar4.position = local_38.position;
    iVar4.node = local_38.node;
    iVar4._12_4_ = 0;
    return iVar4;
  }
LAB_0023f47e:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

auto btree<P>::rebalance_after_delete(iterator iter) -> iterator {
        // Merge/rebalance as we walk back up the tree.
        iterator res(iter);
        bool first_iteration = true;
        for (;;) {
            if (iter.node == root()) {
                try_shrink();
                if (empty()) {
                    return end();
                }
                break;
            }
            if (iter.node->count() >= kMinNodeValues) {
                break;
            }
            bool merged = try_merge_or_rebalance(&iter);
            // On the first iteration, we should update `res` with `iter` because `res`
            // may have been invalidated.
            if (first_iteration) {
                res = iter;
                first_iteration = false;
            }
            if (!merged) {
                break;
            }
            iter.position = iter.node->position();
            iter.node = iter.node->parent();
        }

        // Adjust our return value. If we're pointing at the end of a node, advance
        // the iterator.
        if (res.position == res.node->count()) {
            res.position = res.node->count() - 1;
            ++res;
        }

        return res;
    }